

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsharedpointer.cpp
# Opt level: O2

void QtSharedPointer::internalSafetyCheckAdd(void *d_ptr,void *ptr)

{
  byte bVar1;
  Data *this;
  long lVar2;
  Type *this_00;
  void *pvVar3;
  long lVar4;
  long lVar5;
  QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_knownPointers>_> *in_RSI;
  QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_knownPointers>_> *in_RDI;
  QHash<const_void_*,_(anonymous_namespace)::Data> *this_01;
  long in_FS_OFFSET;
  Data local_88;
  QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_knownPointers>_> *local_80;
  void *local_78;
  QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_knownPointers>_> *local_70;
  undefined1 local_68 [16];
  undefined4 local_58;
  undefined4 uStack_54;
  char *local_50;
  undefined1 local_48 [16];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_80 = in_RSI;
  this_00 = QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_knownPointers>_>::
            operator()(in_RDI);
  if (this_00 == (Type *)0x0) goto LAB_0034a6b3;
  if (in_RSI == (QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_knownPointers>_>
                 *)0x0) {
    local_80 = in_RDI;
  }
  local_48._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_48._0_8_ = this_00;
  QBasicMutex::lock((QBasicMutex *)this_00);
  local_48[8] = true;
  local_68._0_4_ = 0;
  local_68._4_4_ = 0;
  pvVar3 = QHash<const_volatile_void_*,_const_void_*>::value
                     (&this_00->dataPointers,&local_80,(void **)local_68);
  if (pvVar3 != (void *)0x0) {
    local_68._0_4_ = 2;
    uStack_54 = 0;
    local_68._4_4_ = 0;
    local_68._8_4_ = 0;
    local_68._12_4_ = 0;
    local_58._0_1_ = false;
    local_58._1_3_ = 0;
    local_50 = "default";
    QMessageLogger::fatal
              ((QMessageLogger *)local_68,
               "QSharedPointer: internal self-check failed: pointer %p was already tracked by another QSharedPointer object %p"
               ,local_80,pvVar3);
  }
  local_88.pointer = local_80;
  this_01 = &this_00->dPointers;
  this = (this_00->dPointers).d;
  if (this == (Data *)0x0) {
    local_68._0_4_ = 0;
    local_68._4_4_ = 0;
LAB_0034a675:
    QHash<const_void_*,_(anonymous_namespace)::Data>::detach(this_01);
    QHash<void_const*,(anonymous_namespace)::Data>::
    emplace_helper<(anonymous_namespace)::Data_const&>
              ((QHash<void_const*,(anonymous_namespace)::Data> *)this_01,&local_70,&local_88);
    QHash<const_void_*,_(anonymous_namespace)::Data>::~QHash
              ((QHash<const_void_*,_(anonymous_namespace)::Data> *)local_68);
  }
  else {
    if (1 < (uint)(this->ref).atomic._q_value.super___atomic_base<int>._M_i) {
      local_68._0_4_ = SUB84(this,0);
      local_68._4_4_ = (undefined4)((ulong)this >> 0x20);
      if ((this->ref).atomic._q_value.super___atomic_base<int>._M_i != -1) {
        LOCK();
        (this->ref).atomic._q_value.super___atomic_base<int>._M_i =
             (this->ref).atomic._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      goto LAB_0034a675;
    }
    if (this->size < this->numBuckets >> 1) {
      QHash<void_const*,(anonymous_namespace)::Data>::
      emplace_helper<(anonymous_namespace)::Data_const&>
                ((QHash<void_const*,(anonymous_namespace)::Data> *)this_01,&local_70,&local_88);
    }
    else {
      local_58._0_1_ = true;
      local_58._1_3_ = 0xaaaaaa;
      uStack_54 = 0xaaaaaaaa;
      local_68._0_4_ = -0x55555556;
      local_68._4_4_ = -0x55555556;
      local_68._8_4_ = 0xaaaaaaaa;
      local_68._12_4_ = 0xaaaaaaaa;
      local_70 = in_RDI;
      QHashPrivate::Data<QHashPrivate::Node<void_const*,(anonymous_namespace)::Data>>::
      findOrInsert<void_const*>
                ((InsertionResult *)local_68,
                 (Data<QHashPrivate::Node<void_const*,(anonymous_namespace)::Data>> *)this,&local_70
                );
      lVar4 = *(long *)(CONCAT44(local_68._4_4_,local_68._0_4_) + 0x20);
      lVar5 = (CONCAT44(local_68._12_4_,local_68._8_4_) >> 7) * 0x90;
      lVar2 = *(long *)(lVar4 + 0x80 + lVar5);
      bVar1 = *(byte *)((ulong)(local_68._8_4_ & 0x7f) + lVar4 + lVar5);
      if (local_58._0_1_ == false) {
        lVar4 = (ulong)bVar1 * 0x10;
        *(QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_knownPointers>_> **)
         (lVar2 + lVar4) = local_70;
      }
      else {
        lVar4 = (ulong)bVar1 << 4;
      }
      *(QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_knownPointers>_> **)
       (lVar2 + 8 + lVar4) = local_80;
    }
  }
  QHash<void_const_volatile*,void_const*>::emplace<void_const*const&>
            ((QHash<void_const_volatile*,void_const*> *)&this_00->dataPointers,&local_80,&local_78);
  QMutexLocker<QMutex>::~QMutexLocker((QMutexLocker<QMutex> *)local_48);
LAB_0034a6b3:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QtSharedPointer::internalSafetyCheckAdd(const void *d_ptr, const volatile void *ptr)
{
    KnownPointers *const kp = knownPointers();
    if (!kp)
        return;                 // end-game: the application is being destroyed already

    if (!ptr) {
        // nullptr is allowed to be tracked by more than one QSharedPointer, so we
        // need something else to put in our tracking structures
        ptr = d_ptr;
    }

    QMutexLocker lock(&kp->mutex);
    Q_ASSERT(!kp->dPointers.contains(d_ptr));

    //qDebug("Adding d=%p value=%p", d_ptr, ptr);

    const void *other_d_ptr = kp->dataPointers.value(ptr, nullptr);
    if (Q_UNLIKELY(other_d_ptr)) {
#  ifdef BACKTRACE_SUPPORTED
        printBacktrace(knownPointers()->dPointers.value(other_d_ptr).backtrace);
#  endif
        qFatal("QSharedPointer: internal self-check failed: pointer %p was already tracked "
               "by another QSharedPointer object %p", ptr, other_d_ptr);
    }

    Data data;
    data.pointer = ptr;
#  ifdef BACKTRACE_SUPPORTED
    data.backtrace = saveBacktrace();
#  endif

    kp->dPointers.insert(d_ptr, data);
    kp->dataPointers.insert(ptr, d_ptr);
    Q_ASSERT(kp->dPointers.size() == kp->dataPointers.size());
}